

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colmatrix_test.cc
# Opt level: O3

void __thiscall
fizplex::ColMatrix_AssignmentOperator_Test::TestBody(ColMatrix_AssignmentOperator_Test *this)

{
  void *pvVar1;
  bool bVar2;
  long lVar3;
  char *message;
  initializer_list<fizplex::SVector::Nonzero> l;
  initializer_list<fizplex::SVector::Nonzero> l_00;
  initializer_list<fizplex::SVector::Nonzero> l_01;
  initializer_list<fizplex::SVector> colList;
  AssertionResult gtest_ar;
  ColMatrix m33;
  ColMatrix m11;
  long alStack_158 [3];
  SVector local_140;
  SVector local_128;
  SVector local_110;
  Nonzero local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  ColMatrix local_c8;
  ColMatrix local_a0;
  Nonzero local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  Nonzero local_48;
  undefined8 local_38;
  undefined1 *puStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  alStack_158[1] = 0x15ed6f;
  ColMatrix::ColMatrix(&local_a0,1,1);
  local_d8 = 1;
  uStack_d0 = 0;
  local_e8 = 2;
  uStack_e0 = 0xc008000000000000;
  local_f8.index = 0;
  local_f8.value = 7.0;
  alStack_158[1] = 0x15eda6;
  l._M_len = 3;
  l._M_array = &local_f8;
  SVector::SVector(&local_140,l);
  local_58 = 2;
  uStack_50 = 0x4010000000000000;
  local_68 = 1;
  uStack_60 = 0x4008000000000000;
  local_78.index = 0;
  local_78.value = 2.0;
  alStack_158[1] = 0x15ede0;
  l_00._M_len = 3;
  l_00._M_array = &local_78;
  SVector::SVector(&local_128,l_00);
  local_28 = 2;
  uStack_20 = 0xc000000000000000;
  local_38 = 1;
  puStack_30 = &DAT_bff0000000000000;
  local_48.index = 0;
  local_48.value = 1.0;
  alStack_158[1] = 0x15ee1a;
  l_01._M_len = 3;
  l_01._M_array = &local_48;
  SVector::SVector(&local_110,l_01);
  alStack_158[1] = 0x15ee3c;
  colList._M_len = 3;
  colList._M_array = &local_140;
  ColMatrix::ColMatrix(&local_c8,3,3,colList);
  lVar3 = 0x48;
  do {
    pvVar1 = *(void **)((long)alStack_158 + lVar3);
    if (pvVar1 != (void *)0x0) {
      alStack_158[1] = 0x15ee57;
      operator_delete(pvVar1,*(long *)((long)alStack_158 + lVar3 + 0x10) - (long)pvVar1);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != 0);
  alStack_158[1] = 0x15ee72;
  ColMatrix::operator=(&local_a0,&local_c8);
  alStack_158[1] = 0x15ee9a;
  testing::internal::CmpHelperEQ<fizplex::ColMatrix,fizplex::ColMatrix>
            ((internal *)&local_140,"m33","m11",&local_c8,&local_a0);
  if (local_140.values.
      super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>.
      _M_impl.super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    alStack_158[1] = 0x15eeaf;
    testing::Message::Message((Message *)&local_f8);
    if (local_140.values.
        super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>.
        _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      message = "";
    }
    else {
      message = (char *)(local_140.values.
                         super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->index;
    }
    alStack_158[1] = 0x15eee3;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/colmatrix_test.cc"
               ,0x33,message);
    alStack_158[1] = 0x15eef5;
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_f8);
    alStack_158[1] = 0x15ef02;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if ((long *)local_f8.index != (long *)0x0) {
      alStack_158[1] = 0x15ef14;
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_f8.index != (long *)0x0)) {
        alStack_158[1] = 0x15ef28;
        (**(code **)(*(long *)local_f8.index + 8))();
      }
    }
  }
  alStack_158[1] = 0x15ef34;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_140.values.
            super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  alStack_158[1] = 0x15ef41;
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector(&local_c8.cols);
  alStack_158[1] = 0x15ef4e;
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector(&local_a0.cols);
  return;
}

Assistant:

TEST(ColMatrix, AssignmentOperator) {
  ColMatrix m11(1, 1);
  const ColMatrix m33(3, 3,
                      {{{0, 7}, {2, -3}, {1, 0.0}},
                       {{0, 2}, {1, 3}, {2, 4}},
                       {{0, 1}, {1, -1}, {2, -2}}});
  m11 = m33;
  EXPECT_EQ(m33, m11);
}